

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContextInit.cpp
# Opt level: O3

ContextInitializer * __thiscall
Imf_3_4::ContextInitializer::setOutputStream(ContextInitializer *this,OStream *ostr)

{
  int iVar1;
  undefined8 *puVar2;
  undefined4 extraout_var;
  
  puVar2 = (undefined8 *)operator_new(0x38);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[3] = 0;
  puVar2[4] = 0;
  puVar2[5] = 0;
  puVar2[6] = ostr;
  if (ostr != (OStream *)0x0) {
    iVar1 = (*ostr->_vptr_OStream[3])(ostr);
    puVar2[5] = CONCAT44(extraout_var,iVar1);
  }
  (this->_initializer).user_data = puVar2;
  (this->_initializer).read_fn = (exr_read_func_ptr_t)0x0;
  (this->_initializer).size_fn = (exr_query_size_func_ptr_t)0x0;
  (this->_initializer).write_fn = ostream_write;
  (this->_initializer).destroy_fn = ostream_destroy;
  this->_ctxt_type = WRITE;
  return this;
}

Assistant:

ContextInitializer&
ContextInitializer::setOutputStream (OStream* ostr)
{
    _initializer.user_data  = new ostream_holder{ostr};
    _initializer.read_fn    = nullptr;
    _initializer.size_fn    = nullptr;
    _initializer.write_fn   = ostream_write;
    _initializer.destroy_fn = ostream_destroy;
    _ctxt_type              = ContextFileType::WRITE;
    return *this;
}